

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit-value-types.cc
# Opt level: O1

void value_types_test(void)

{
  int iVar1;
  uint32_t uVar2;
  texcoord2f *ptVar3;
  uint32_t tyid;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t extraout_EDX_01;
  uint32_t extraout_EDX_02;
  uint cond;
  uint uVar4;
  float fVar5;
  float fVar6;
  Value value;
  token tok1;
  token tok3;
  token tok2;
  undefined1 local_a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  Token local_78;
  Token local_58;
  Token local_38;
  
  tinyusdz::Token::Token(&local_78,"bora");
  tinyusdz::Token::Token(&local_38,"muda");
  tinyusdz::Token::Token(&local_58,"bora");
  uVar4 = 1;
  acutest_check_(1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-value-types.cc"
                 ,0x13,"%s","tok1 == tok1");
  if (local_78.str_._M_string_length == local_38.str_._M_string_length) {
    if (local_78.str_._M_string_length == 0) {
      uVar4 = 0;
    }
    else {
      iVar1 = bcmp(local_78.str_._M_dataplus._M_p,local_38.str_._M_dataplus._M_p,
                   local_78.str_._M_string_length);
      uVar4 = (uint)(iVar1 != 0);
    }
  }
  cond = 0;
  acutest_check_(uVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-value-types.cc"
                 ,0x14,"%s","tok1 != tok2");
  if (local_78.str_._M_string_length == local_58.str_._M_string_length) {
    if (local_78.str_._M_string_length == 0) {
      cond = 1;
    }
    else {
      iVar1 = bcmp(local_78.str_._M_dataplus._M_p,local_58.str_._M_dataplus._M_p,
                   local_78.str_._M_string_length);
      cond = (uint)(iVar1 == 0);
    }
  }
  acutest_check_(cond,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-value-types.cc"
                 ,0x15,"%s","tok1 == tok3");
  tinyusdz::value::GetTypeName_abi_cxx11_((string *)local_a0,(value *)0x6,tyid);
  iVar1 = std::__cxx11::string::compare(local_a0);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-value-types.cc"
                 ,0x17,"%s","value::GetTypeName(value::TYPE_ID_TOKEN) == \"token\"");
  uVar2 = extraout_EDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._0_8_ != &local_90) {
    operator_delete((void *)local_a0._0_8_,local_90._M_allocated_capacity + 1);
    uVar2 = extraout_EDX_00;
  }
  tinyusdz::value::GetTypeName_abi_cxx11_
            ((string *)local_a0,
             (value *)&std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>.
                       e_ident_version,uVar2);
  iVar1 = std::__cxx11::string::compare(local_a0);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-value-types.cc"
                 ,0x18,"%s",
                 "value::GetTypeName(value::TYPE_ID_TOKEN|value::TYPE_ID_1D_ARRAY_BIT) == \"token[]\""
                );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._0_8_ != &local_90) {
    operator_delete((void *)local_a0._0_8_,local_90._M_allocated_capacity + 1);
  }
  local_a0._0_8_ = &local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"token","");
  uVar2 = tinyusdz::value::GetTypeId((string *)local_a0);
  acutest_check_((uint)(uVar2 == 6),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-value-types.cc"
                 ,0x1a,"%s","value::GetTypeId(\"token\") == value::TYPE_ID_TOKEN");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._0_8_ != &local_90) {
    operator_delete((void *)local_a0._0_8_,local_90._M_allocated_capacity + 1);
  }
  local_a0._0_8_ = &local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"token[]","");
  uVar2 = tinyusdz::value::GetTypeId((string *)local_a0);
  acutest_check_((uint)(uVar2 == 0x100006),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-value-types.cc"
                 ,0x1b,"%s",
                 "value::GetTypeId(\"token[]\") == (value::TYPE_ID_TOKEN|value::TYPE_ID_1D_ARRAY_BIT)"
                );
  uVar2 = extraout_EDX_01;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._0_8_ != &local_90) {
    operator_delete((void *)local_a0._0_8_,local_90._M_allocated_capacity + 1);
    uVar2 = extraout_EDX_02;
  }
  tinyusdz::value::TryGetTypeName_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_a0,(value *)0xffffff,uVar2);
  acutest_check_((byte)local_a0[0] ^ 1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-value-types.cc"
                 ,0x1d,"%s","!value::TryGetTypeName(value::TYPE_ID_ALL)");
  if (((string)local_a0[0] == (string)0x1) && (local_a0._8_8_ != (long)&local_90 + 8U)) {
    operator_delete((void *)local_a0._8_8_,local_90._8_8_ + 1);
  }
  local_90._M_allocated_capacity =
       (size_type)linb::any::vtable_for_type<std::array<float,2ul>>()::table;
  local_a0._0_8_ = (pointer)0x400000003f800000;
  ptVar3 = tinyusdz::value::Value::as<tinyusdz::value::texcoord2f>((Value *)local_a0,false);
  acutest_check_((uint)(ptVar3 != (texcoord2f *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-value-types.cc"
                 ,0x24,"%s","tex2f != nullptr");
  if (ptVar3 != (texcoord2f *)0x0) {
    fVar6 = ABS(ptVar3->s + -1.0);
    uVar4 = 1;
    if (1.1920929e-07 < fVar6) {
      fVar5 = ABS(ptVar3->s);
      if (fVar5 <= 1.0) {
        fVar5 = 1.0;
      }
      uVar4 = (uint)(fVar6 <= fVar5 * 1.1920929e-07);
    }
    acutest_check_(uVar4,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-value-types.cc"
                   ,0x26,"%s","math::is_close(tex2f->s, 1.0f)");
    fVar6 = ABS(ptVar3->t + -2.0);
    uVar4 = 1;
    if (1.1920929e-07 < fVar6) {
      fVar5 = ABS(ptVar3->t);
      if (fVar5 <= 2.0) {
        fVar5 = 2.0;
      }
      uVar4 = (uint)(fVar6 <= fVar5 * 1.1920929e-07);
    }
    acutest_check_(uVar4,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-value-types.cc"
                   ,0x27,"%s","math::is_close(tex2f->t, 2.0f)");
  }
  if ((undefined1 *)local_90._M_allocated_capacity != (undefined1 *)0x0) {
    (**(code **)(local_90._M_allocated_capacity + 0x20))(local_a0);
    local_90._M_allocated_capacity = 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.str_._M_dataplus._M_p != &local_58.str_.field_2) {
    operator_delete(local_58.str_._M_dataplus._M_p,local_58.str_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.str_._M_dataplus._M_p != &local_38.str_.field_2) {
    operator_delete(local_38.str_._M_dataplus._M_p,local_38.str_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.str_._M_dataplus._M_p != &local_78.str_.field_2) {
    operator_delete(local_78.str_._M_dataplus._M_p,local_78.str_.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void value_types_test(void) {

  value::token tok1("bora");
  value::token tok2("muda");
  value::token tok3("bora");
  TEST_CHECK(tok1 == tok1);
  TEST_CHECK(tok1 != tok2);
  TEST_CHECK(tok1 == tok3);

  TEST_CHECK(value::GetTypeName(value::TYPE_ID_TOKEN) == "token");
  TEST_CHECK(value::GetTypeName(value::TYPE_ID_TOKEN|value::TYPE_ID_1D_ARRAY_BIT) == "token[]");

  TEST_CHECK(value::GetTypeId("token") == value::TYPE_ID_TOKEN);
  TEST_CHECK(value::GetTypeId("token[]") == (value::TYPE_ID_TOKEN|value::TYPE_ID_1D_ARRAY_BIT));

  TEST_CHECK(!value::TryGetTypeName(value::TYPE_ID_ALL));

  // texCoord2f <-> float2 cast
  value::float2 uv{1.0f, 2.0f};
  value::Value value(uv);

  value::texcoord2f *tex2f = value.as<value::texcoord2f>();
  TEST_CHECK(tex2f != nullptr);
  if (tex2f) {
    TEST_CHECK(math::is_close(tex2f->s, 1.0f));
    TEST_CHECK(math::is_close(tex2f->t, 2.0f));
  }

}